

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# division_operations.c
# Opt level: O0

int32_t WebRtcSpl_DivResultInQ31(int32_t num,int32_t den)

{
  int iVar1;
  char cVar2;
  undefined4 local_24;
  int change_sign;
  int k;
  int32_t div;
  int32_t L_den;
  int32_t L_num;
  int32_t den_local;
  int32_t num_local;
  
  change_sign = 0;
  local_24 = 0x1f;
  if (num == 0) {
    den_local = 0;
  }
  else {
    cVar2 = num < 0;
    div = num;
    if ((bool)cVar2) {
      div = -num;
    }
    k = den;
    if (den < 0) {
      cVar2 = cVar2 + '\x01';
      k = -den;
    }
    while (iVar1 = local_24 + -1, local_24 != 0) {
      change_sign = change_sign * 2;
      div = div * 2;
      local_24 = iVar1;
      if (k <= div) {
        div = div - k;
        change_sign = change_sign + 1;
      }
    }
    if (cVar2 == '\x01') {
      change_sign = -change_sign;
    }
    den_local = change_sign;
  }
  return den_local;
}

Assistant:

int32_t WebRtcSpl_DivResultInQ31(int32_t num, int32_t den)
{
    int32_t L_num = num;
    int32_t L_den = den;
    int32_t div = 0;
    int k = 31;
    int change_sign = 0;

    if (num == 0)
        return 0;

    if (num < 0)
    {
        change_sign++;
        L_num = -num;
    }
    if (den < 0)
    {
        change_sign++;
        L_den = -den;
    }
    while (k--)
    {
        div <<= 1;
        L_num <<= 1;
        if (L_num >= L_den)
        {
            L_num -= L_den;
            div++;
        }
    }
    if (change_sign == 1)
    {
        div = -div;
    }
    return div;
}